

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scopes.cpp
# Opt level: O2

void __thiscall
example::example(example *this,shared_ptr<per_request> *sp1,shared_ptr<per_request> *sp2,shared *s1,
                shared *s2)

{
  uint __line;
  char *__assertion;
  
  if ((sp1->super___shared_ptr<per_request,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (sp2->super___shared_ptr<per_request,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
    __assertion = "sp1 != sp2";
    __line = 0x26;
  }
  else {
    if (s1 == s2) {
      return;
    }
    __assertion = "&s1 == &s2";
    __line = 0x27;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/scopes.cpp"
                ,__line,
                "example::example(std::shared_ptr<per_request>, std::shared_ptr<per_request>, const shared &, shared &)"
               );
}

Assistant:

example(std::shared_ptr<per_request> sp1 /*unique*/
        , std::shared_ptr<per_request> sp2 /*unique*/
        , const shared& s1 /*singleton*/
        , shared& s2 /*singleton*/) {
    assert(sp1 != sp2);
    assert(&s1 == &s2);
  }